

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_msl_resource_binding(CompilerMSL *this,MSLResourceBinding *binding)

{
  BaseType BVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  runtime_error *this_00;
  StageSetBinding arg_idx_tuple;
  key_type local_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  key_type local_2c;
  
  local_2c.model = binding->stage;
  local_2c.desc_set = binding->desc_set;
  local_2c.binding = binding->binding;
  local_58._0_4_ = binding->stage;
  local_58._4_4_ = binding->basetype;
  uStack_50._0_4_ = binding->desc_set;
  uStack_50._4_4_ = binding->binding;
  local_48._0_4_ = binding->count;
  local_48._4_4_ = binding->msl_buffer;
  uStack_40._0_4_ = binding->msl_texture;
  uStack_40._4_4_ = binding->msl_sampler;
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->resource_bindings,&local_2c);
  (pmVar3->first).stage = (ExecutionModel)local_58;
  (pmVar3->first).basetype = local_58._4_4_;
  (pmVar3->first).desc_set = (uint32_t)uStack_50;
  (pmVar3->first).binding = uStack_50._4_4_;
  (pmVar3->first).count = (uint32_t)local_48;
  (pmVar3->first).msl_buffer = local_48._4_4_;
  (pmVar3->first).msl_texture = (uint32_t)uStack_40;
  (pmVar3->first).msl_sampler = uStack_40._4_4_;
  pmVar3->second = false;
  if ((this->msl_options).pad_argument_buffer_resources == true) {
    local_64.model = binding->stage;
    local_64.desc_set = binding->desc_set;
    local_64.binding = 0xffffffff;
    BVar1 = binding->basetype;
    if (BVar1 - Void < 0xe) {
      local_64.binding = binding->msl_buffer;
    }
    else if (BVar1 == Image) {
      local_64.binding = binding->msl_texture;
    }
    else if (BVar1 == SampledImage) {
      local_64.binding = binding->msl_texture;
      mVar2 = binding->binding;
      pmVar4 = ::std::__detail::
               _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->resource_arg_buff_idx_to_binding_number,&local_64);
      *pmVar4 = mVar2;
      local_64.binding = binding->msl_sampler;
    }
    else {
      if (BVar1 != Sampler) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_58 = &local_48;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "Unexpected argument buffer resource base type. When padding argument buffer elements, all descriptor set resources must be supplied with a base type by the app."
                   ,"");
        ::std::runtime_error::runtime_error(this_00,(string *)&local_58);
        *(undefined ***)this_00 = &PTR__runtime_error_003f8e68;
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_64.binding = binding->msl_sampler;
    }
    mVar2 = binding->binding;
    pmVar4 = ::std::__detail::
             _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->resource_arg_buff_idx_to_binding_number,&local_64);
    *pmVar4 = mVar2;
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_resource_binding(const MSLResourceBinding &binding)
{
	StageSetBinding tuple = { binding.stage, binding.desc_set, binding.binding };
	resource_bindings[tuple] = { binding, false };

	// If we might need to pad argument buffer members to positionally align
	// arg buffer indexes, also maintain a lookup by argument buffer index.
	if (msl_options.pad_argument_buffer_resources)
	{
		StageSetBinding arg_idx_tuple = { binding.stage, binding.desc_set, k_unknown_component };

#define ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(rez) \
	arg_idx_tuple.binding = binding.msl_##rez; \
	resource_arg_buff_idx_to_binding_number[arg_idx_tuple] = binding.binding

		switch (binding.basetype)
		{
		case SPIRType::Void:
		case SPIRType::Boolean:
		case SPIRType::SByte:
		case SPIRType::UByte:
		case SPIRType::Short:
		case SPIRType::UShort:
		case SPIRType::Int:
		case SPIRType::UInt:
		case SPIRType::Int64:
		case SPIRType::UInt64:
		case SPIRType::AtomicCounter:
		case SPIRType::Half:
		case SPIRType::Float:
		case SPIRType::Double:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(buffer);
			break;
		case SPIRType::Image:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			break;
		case SPIRType::Sampler:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		case SPIRType::SampledImage:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		default:
			SPIRV_CROSS_THROW("Unexpected argument buffer resource base type. When padding argument buffer elements, "
			                  "all descriptor set resources must be supplied with a base type by the app.");
		}
#undef ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP
	}
}